

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set.h
# Opt level: O3

const_iterator __thiscall
frozen::unordered_set<frozen::basic_string<char>,3ul,frozen::elsa<void>,eq>::
find<std::__cxx11::string>
          (unordered_set<frozen::basic_string<char>,3ul,frozen::elsa<void>,eq> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  const_iterator this_00;
  size_t sVar1;
  const_iterator pvVar2;
  size_t sVar3;
  const_iterator pvVar4;
  
  this_00 = (const_iterator)(this + 0x30);
  sVar1 = bits::pmh_tables<8ul,frozen::elsa<void>>::lookup<std::__cxx11::string,frozen::elsa<void>>
                    ((pmh_tables<8ul,frozen::elsa<void>> *)this_00,key,(elsa<void> *)this_00);
  pvVar2 = this_00;
  if (sVar1 != 3) {
    pvVar4 = (const_iterator)(this + sVar1 * 0x10);
    sVar1 = key->_M_string_length;
    if ((pvVar4->size_ == sVar1) && (pvVar2 = pvVar4, sVar1 != 0)) {
      sVar3 = 0;
      do {
        if (pvVar4->data_[sVar3] != (key->_M_dataplus)._M_p[sVar3]) {
          return this_00;
        }
        sVar3 = sVar3 + 1;
      } while (sVar1 != sVar3);
    }
  }
  return pvVar2;
}

Assistant:

constexpr const_iterator find(KeyType const &key) const {
    auto const pos = tables_.lookup(key, hash_function());
    auto it = keys_.begin() + pos;
    if (it != keys_.end() && key_eq()(*it, key))
      return it;
    else
      return keys_.end();
  }